

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::MessageOptions::SharedCtor(MessageOptions *this,Arena *arena)

{
  Arena *arena_local;
  MessageOptions *this_local;
  
  protobuf::MessageLite::internal_visibility();
  Impl_::Impl_((Impl_ *)&this->field_0);
  memset((void *)((long)&this->field_0 + 0x38),0,0xd);
  return;
}

Assistant:

inline void MessageOptions::SharedCtor(::_pb::Arena* PROTOBUF_NULLABLE arena) {
  new (&_impl_) Impl_(internal_visibility(), arena);
  ::memset(reinterpret_cast<char *>(&_impl_) +
               offsetof(Impl_, features_),
           0,
           offsetof(Impl_, deprecated_legacy_json_field_conflicts_) -
               offsetof(Impl_, features_) +
               sizeof(Impl_::deprecated_legacy_json_field_conflicts_));
}